

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

void container_suite::test_array_bool_one(void)

{
  char cVar1;
  undefined8 uVar2;
  bool bVar3;
  encoder_type encoder;
  ostringstream result;
  undefined8 local_1e0;
  long *local_1d8;
  undefined5 *local_1d0;
  long local_1c8 [2];
  undefined **local_1b8;
  ostringstream *local_1b0;
  long local_190 [4];
  int aiStack_170 [20];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  local_1b8 = &PTR__base_00118c10;
  bVar3 = *(int *)((long)aiStack_170 + *(long *)(local_190[0] + -0x18)) == 0;
  local_1b0 = (ostringstream *)local_190;
  if (bVar3) {
    local_1e0 = CONCAT71(local_1e0._1_7_,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)&local_1e0,1);
  }
  local_1d8 = (long *)(ulong)bVar3;
  local_1e0 = CONCAT44(local_1e0._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::begin_array>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x382,"void container_suite::test_array_bool_one()",&local_1d8,&local_1e0);
  local_1d8 = (long *)0x5;
  local_1d0 = &trial::protocol::json::detail::basic_encoder<char,24ul>::value(bool)::false_text;
  cVar1 = (*(code *)local_1b8[2])(&local_1b8,5);
  if (cVar1 == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = 5;
    (*(code *)local_1b8[4])(&local_1b8,&local_1d8);
  }
  local_1d8 = (long *)CONCAT44(local_1d8._4_4_,5);
  local_1e0 = uVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(false)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,899,"void container_suite::test_array_bool_one()",&local_1e0,&local_1d8);
  cVar1 = (*(code *)local_1b8[2])(&local_1b8,1);
  if (cVar1 != '\0') {
    (*(code *)local_1b8[3])(&local_1b8,0x5d);
  }
  local_1d8 = (long *)(ulong)(cVar1 != '\0');
  local_1e0 = CONCAT44(local_1e0._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::end_array>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,900,"void container_suite::test_array_bool_one()",&local_1d8,&local_1e0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[8]>
            ("result.str()","\"[false]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x385,"void container_suite::test_array_bool_one()",&local_1d8,"[false]");
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  (*(code *)*local_1b8)();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void test_array_bool_one()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::begin_array>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(false), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::end_array>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[false]");
}